

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O2

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags)

{
  size_t sVar1;
  undefined1 uVar2;
  mz_bool mVar3;
  mz_uint mVar4;
  int iVar5;
  tdefl_status tVar6;
  FILE *__stream;
  tdefl_compressor *ptVar7;
  size_t sVar8;
  mz_uint8 *pmVar9;
  tdefl_compressor *ptVar10;
  ushort uVar11;
  uint uVar12;
  tdefl_compressor *ptVar13;
  void *pvVar14;
  undefined1 *puVar15;
  mz_uint16 dos_date_00;
  mz_uint64 in_stack_fffffffffffffed8;
  mz_uint64 mVar16;
  mz_ulong uncomp_size;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  FILE *local_110;
  tdefl_compressor *local_108;
  tdefl_compressor *local_100;
  mz_uint8 *local_f8;
  tdefl_compressor *local_f0;
  size_t local_e8;
  ulong local_e0;
  mz_uint64 local_d8;
  void *local_d0;
  mz_zip_writer_add_state state;
  time_t local_70;
  
  dos_time = 0;
  dos_date = 0;
  uVar12 = 6;
  if (-1 < (int)level_and_flags) {
    uVar12 = level_and_flags;
  }
  if (pZip->m_pState == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pArchive_name == (char *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if ((uVar12 >> 10 & 1) != 0) {
    return 0;
  }
  if (pComment == (void *)0x0 && comment_size != 0) {
    return 0;
  }
  if (10 < (uVar12 & 0xf)) {
    return 0;
  }
  mVar16 = pZip->m_archive_size;
  local_d0 = pComment;
  mVar3 = mz_zip_writer_validate_archive_name(pArchive_name);
  if (mVar3 == 0) {
    return 0;
  }
  local_e8 = strlen(pArchive_name);
  if (0xffff < local_e8) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  mVar4 = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  local_108 = (tdefl_compressor *)(ulong)mVar4;
  local_d8 = (long)local_108->m_max_probes + (mVar16 - 0x14);
  local_e0 = (ulong)comment_size;
  if (local_e8 + local_e0 + local_d8 + 0x4c >> 0x20 != 0) {
    return 0;
  }
  iVar5 = stat(pSrc_filename,(stat *)&state);
  if (iVar5 != 0) {
    return 0;
  }
  mz_zip_time_to_dos_time(local_70,&dos_time,&dos_date);
  __stream = fopen(pSrc_filename,"rb");
  if (__stream == (FILE *)0x0) {
    return 0;
  }
  fseeko(__stream,0,2);
  ptVar7 = (tdefl_compressor *)ftello(__stream);
  fseeko(__stream,0,0);
  if ((ulong)ptVar7 >> 0x20 != 0) {
LAB_0012daa0:
    fclose(__stream);
    return 0;
  }
  uVar12 = uVar12 & 0xf;
  if (ptVar7 < (tdefl_compressor *)0x4) {
    uVar12 = 0;
  }
  puVar15 = (undefined1 *)((long)&local_108->m_greedy_parsing + 2);
  local_110 = __stream;
  local_100 = ptVar7;
  mVar3 = mz_zip_writer_write_zeros(pZip,mVar16,(mz_uint32)puVar15);
  sVar1 = local_e8;
  if (mVar3 == 0) {
    return 0;
  }
  puVar15 = puVar15 + mVar16;
  sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)puVar15,pArchive_name,local_e8);
  __stream = local_110;
  if (sVar8 != sVar1) goto LAB_0012daa0;
  puVar15 = puVar15 + sVar1;
  if (local_100 == (tdefl_compressor *)0x0) {
    ptVar7 = (tdefl_compressor *)0x0;
    uVar11 = 0;
    uncomp_size = 0;
    goto LAB_0012db7f;
  }
  pmVar9 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
  if (pmVar9 == (mz_uint8 *)0x0) goto LAB_0012db4a;
  local_f8 = pmVar9;
  if (uVar12 != 0) {
    ptVar7 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (ptVar7 != (tdefl_compressor *)0x0) {
      state.m_comp_size = 0;
      uncomp_size = 0;
      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = (mz_uint64)puVar15;
      mVar4 = tdefl_create_comp_flags_from_zip_params(uVar12,-0xf,0);
      local_108 = ptVar7;
      tdefl_init(ptVar7,mz_zip_writer_add_put_buf_callback,&state,mVar4);
      pmVar9 = local_f8;
      ptVar7 = local_100;
      do {
        ptVar13 = (tdefl_compressor *)0x10000;
        if (ptVar7 < (tdefl_compressor *)0x10000) {
          ptVar13 = ptVar7;
        }
        ptVar10 = (tdefl_compressor *)fread(pmVar9,1,(size_t)ptVar13,local_110);
        local_f0 = (tdefl_compressor *)CONCAT71(local_f0._1_7_,ptVar10 != ptVar13);
        if (ptVar10 != ptVar13) goto LAB_0012da75;
        uncomp_size = mz_crc32(uncomp_size & 0xffffffff,pmVar9,(size_t)ptVar13);
        ptVar7 = (tdefl_compressor *)((long)ptVar7 - (long)ptVar13);
        tVar6 = tdefl_compress_buffer
                          (local_108,pmVar9,(size_t)ptVar13,
                           (uint)(ptVar7 == (tdefl_compressor *)0x0) << 2);
      } while (tVar6 == TDEFL_STATUS_OKAY);
      if (tVar6 != TDEFL_STATUS_DONE) {
        local_f0 = (tdefl_compressor *)CONCAT71(local_f0._1_7_,1);
      }
LAB_0012da75:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_108);
      if ((char)local_f0 == '\0') {
        uVar11 = 8;
        ptVar7 = (tdefl_compressor *)state.m_comp_size;
        puVar15 = (undefined1 *)state.m_cur_archive_file_ofs;
        goto LAB_0012db72;
      }
    }
    pvVar14 = pZip->m_pAlloc_opaque;
    pmVar9 = local_f8;
LAB_0012db46:
    (*pZip->m_pFree)(pvVar14,pmVar9);
LAB_0012db4a:
    fclose(local_110);
    return 0;
  }
  uncomp_size = 0;
  ptVar7 = local_100;
  while (ptVar7 != (tdefl_compressor *)0x0) {
    ptVar13 = (tdefl_compressor *)0x10000;
    if (ptVar7 < (tdefl_compressor *)0x10000) {
      ptVar13 = ptVar7;
    }
    local_108 = ptVar7;
    ptVar7 = (tdefl_compressor *)fread(pmVar9,1,(size_t)ptVar13,local_110);
    if ((ptVar7 != ptVar13) ||
       (ptVar7 = (tdefl_compressor *)
                 (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)puVar15,pmVar9,(size_t)ptVar13),
       ptVar7 != ptVar13)) {
      pvVar14 = pZip->m_pAlloc_opaque;
      goto LAB_0012db46;
    }
    uncomp_size = mz_crc32(uncomp_size & 0xffffffff,pmVar9,(size_t)ptVar13);
    puVar15 = puVar15 + (long)ptVar13;
    ptVar7 = (tdefl_compressor *)((long)local_108 - (long)ptVar13);
  }
  uVar11 = 0;
  ptVar7 = local_100;
LAB_0012db72:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_f8);
LAB_0012db7f:
  fclose(local_110);
  mVar16 = local_d8;
  if ((ulong)ptVar7 >> 0x20 != 0) {
    return 0;
  }
  if ((ulong)puVar15 >> 0x20 != 0) {
    return 0;
  }
  uVar2 = 0x14;
  if (uVar11 == 0) {
    uVar2 = 0;
  }
  state.m_pZip = (mz_zip_archive *)CONCAT35(0,CONCAT14(uVar2,0x4034b50));
  local_108 = (tdefl_compressor *)CONCAT44(local_108._4_4_,(uint)dos_time);
  local_110 = (FILE *)CONCAT44(local_110._4_4_,(uint)dos_date);
  state.m_cur_archive_file_ofs =
       CONCAT17((char)(uncomp_size >> 8),
                CONCAT16((char)uncomp_size,
                         CONCAT15((char)(dos_date >> 8),
                                  CONCAT14((char)dos_date,
                                           CONCAT13((char)(dos_time >> 8),
                                                    CONCAT12((char)dos_time,uVar11))))));
  state.m_comp_size =
       CONCAT17((char)((ulong)local_100 >> 8),
                CONCAT16((char)local_100,
                         CONCAT15((char)((ulong)ptVar7 >> 0x18),
                                  CONCAT14((char)((ulong)ptVar7 >> 0x10),
                                           CONCAT13((char)((ulong)ptVar7 >> 8),
                                                    CONCAT12((char)ptVar7,
                                                             (short)(uncomp_size >> 0x10)))))));
  dos_date_00 = 0xdc6d;
  local_f0 = ptVar7;
  sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_d8,&state,0x1e);
  if (sVar8 != 0x1e) {
    return 0;
  }
  mVar3 = mz_zip_writer_add_to_central_dir
                    (pZip,pArchive_name,(mz_uint16)local_e8,local_d0,(mz_uint16)local_e0,local_100,
                     (mz_uint16)local_f0,uncomp_size,(ulong)uVar11,(uint)local_108 & 0xffff,
                     (mz_uint16)local_110,(mz_uint16)mVar16,0,dos_date_00,in_stack_fffffffffffffed8,
                     (mz_uint32)uncomp_size);
  if (mVar3 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = (mz_uint64)puVar15;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive* pZip, const char* pArchive_name, const char* pSrc_filename, const void* pComment, mz_uint16 comment_size, mz_uint level_and_flags) {
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0, ext_attributes = 0;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, uncomp_size = 0, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  MZ_FILE* pSrc_file = NULL;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;
  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) || ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_get_file_modified_time(pSrc_filename, &dos_time, &dos_date))
    return MZ_FALSE;

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return MZ_FALSE;
  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  if (uncomp_size > 0xFFFFFFFF) {
    // No zip64 support yet
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  if (uncomp_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes + sizeof(local_dir_header)))
    return MZ_FALSE;
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
  }
  cur_archive_file_ofs += num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (uncomp_size) {
    mz_uint64 uncomp_remaining = uncomp_size;
    void* pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      MZ_FCLOSE(pSrc_file);
      return MZ_FALSE;
    }

    if (!level) {
      while (uncomp_remaining) {
        mz_uint n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
        if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) || (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf, n) != n)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          MZ_FCLOSE(pSrc_file);
          return MZ_FALSE;
        }
        uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8*)pRead_buf, n);
        uncomp_remaining -= n;
        cur_archive_file_ofs += n;
      }
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor* pComp = (tdefl_compressor*)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      for (;;) {
        size_t in_buf_size = (mz_uint32)MZ_MIN(uncomp_remaining, MZ_ZIP_MAX_IO_BUF_SIZE);
        tdefl_status status;

        if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
          break;

        uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8*)pRead_buf, in_buf_size);
        uncomp_remaining -= in_buf_size;

        status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size, uncomp_remaining ? TDEFL_NO_FLUSH : TDEFL_FINISH);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY)
          break;
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;

      method = MZ_DEFLATED;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  MZ_FCLOSE(pSrc_file);
  pSrc_file = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size, comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment, comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0, dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}